

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O0

void __thiscall
node::SnapshotMetadata::SnapshotMetadata(SnapshotMetadata *this,MessageStartChars network_magic)

{
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *unaff_retaddr;
  initializer_list<unsigned_short> in_stack_00000010;
  allocator<unsigned_short> *in_stack_ffffffffffffffa8;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 uVar1;
  less<unsigned_short> *__comp;
  
  __comp = *(less<unsigned_short> **)(in_FS_OFFSET + 0x28);
  uVar1 = 2;
  std::allocator<unsigned_short>::allocator(in_stack_ffffffffffffffa8);
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            (unaff_retaddr,in_stack_00000010,__comp,
             (allocator_type *)CONCAT44(in_ESI,CONCAT22(uVar1,in_stack_fffffffffffffff0)));
  std::allocator<unsigned_short>::~allocator(in_stack_ffffffffffffffa8);
  *(undefined4 *)(in_RDI + 0x30) = in_ESI;
  uint256::uint256((uint256 *)in_stack_ffffffffffffffa8);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  if (*(less<unsigned_short> **)(in_FS_OFFSET + 0x28) == __comp) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SnapshotMetadata(
        const MessageStartChars network_magic) :
            m_network_magic(network_magic) { }